

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof_data.c
# Opt level: O3

void duckdb_je_prof_tdata_detach(tsd_t *tsd,prof_tdata_t *tdata)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  malloc_mutex_t *pmVar3;
  int iVar4;
  size_t sVar5;
  _Bool even_if_attached;
  mutex_prof_data_t *data;
  
  pmVar3 = tdata->lock;
  iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)&pmVar3->field_0 + 0x48));
  if (iVar4 != 0) {
    duckdb_je_malloc_mutex_lock_slow(pmVar3);
    (pmVar3->field_0).field_0.locked.repr = true;
  }
  puVar1 = &(pmVar3->field_0).field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if (&((pmVar3->field_0).field_0.prof_data.prev_owner)->tsd != tsd) {
    (pmVar3->field_0).field_0.prof_data.prev_owner = (tsdn_t *)tsd;
    ppwVar2 = &(pmVar3->field_0).witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  if (tdata->attached == true) {
    sVar5 = duckdb_je_ckh_count(&tdata->bt2tctx);
    if (sVar5 == 0) {
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prof_tdata = (prof_tdata_t *)0x0;
      pmVar3 = tdata->lock;
      (pmVar3->field_0).field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar3->field_0 + 0x48));
      prof_tdata_destroy(tsd,tdata,even_if_attached);
      return;
    }
    tdata->attached = false;
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prof_tdata = (prof_tdata_t *)0x0;
  }
  pmVar3 = tdata->lock;
  (pmVar3->field_0).field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar3->field_0 + 0x48));
  return;
}

Assistant:

void
prof_tdata_detach(tsd_t *tsd, prof_tdata_t *tdata) {
	bool destroy_tdata;

	malloc_mutex_lock(tsd_tsdn(tsd), tdata->lock);
	if (tdata->attached) {
		destroy_tdata = prof_tdata_should_destroy(tsd_tsdn(tsd), tdata,
		    true);
		/*
		 * Only detach if !destroy_tdata, because detaching would allow
		 * another thread to win the race to destroy tdata.
		 */
		if (!destroy_tdata) {
			tdata->attached = false;
		}
		tsd_prof_tdata_set(tsd, NULL);
	} else {
		destroy_tdata = false;
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), tdata->lock);
	if (destroy_tdata) {
		prof_tdata_destroy(tsd, tdata, true);
	}
}